

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhugeint.cpp
# Opt level: O1

bool duckdb::ConvertFloatingToUhugeint<long_double>(longdouble value,uhugeint_t *result)

{
  longdouble lVar1;
  longdouble lVar2;
  longdouble lVar3;
  double dVar4;
  
  if (value < (longdouble)3.402823669209385e+38 && (longdouble)0 <= value) {
    dVar4 = fmod((double)value,1.8446744073709552e+19);
    lVar3 = value / _DAT_01df10f0;
    lVar1 = (longdouble)9.223372e+18;
    lVar2 = (longdouble)0;
    if (lVar1 <= lVar3) {
      lVar2 = lVar1;
    }
    result->lower = (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4;
    result->upper = (ulong)(lVar1 <= lVar3) << 0x3f ^ (long)ROUND(lVar3 - lVar2);
  }
  return value < (longdouble)3.402823669209385e+38 && (longdouble)0 <= value;
}

Assistant:

bool ConvertFloatingToUhugeint(REAL_T value, uhugeint_t &result) {
	if (!Value::IsFinite<REAL_T>(value)) {
		return false;
	}
	if (value < 0 || value >= 340282366920938463463374607431768211456.0) {
		return false;
	}
	result.lower = (uint64_t)fmod(value, REAL_T(NumericLimits<uint64_t>::Maximum()));
	result.upper = (uint64_t)(value / REAL_T(NumericLimits<uint64_t>::Maximum()));
	return true;
}